

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O2

void __thiscall pstore::broker::gc_watch_thread::start_vacuum(gc_watch_thread *this,string *db_path)

{
  pointer pcVar1;
  bool bVar2;
  char *message;
  not_null<const_char_*> *this_00;
  int local_84;
  unique_lock<std::mutex> lock;
  undefined8 local_70 [4];
  not_null<const_char_*> local_50;
  not_null<const_char_*> local_48;
  not_null<const_char_*> local_40;
  undefined8 local_38;
  pointer local_30;
  undefined8 local_28;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mut_);
  bVar2 = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
          ::presentl(&this->processes_,db_path);
  if (bVar2) {
    local_40.ptr_ = (db_path->_M_dataplus)._M_p;
    this_00 = &local_40;
    message = "GC process is already running for ";
  }
  else {
    pcVar1 = (db_path->_M_dataplus)._M_p;
    if ((this->processes_).left_._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x32) {
      local_50.ptr_ = pcVar1;
      pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_50);
      log<pstore::logger::quoted>(info,"Starting GC process for ",(quoted)local_50.ptr_);
      vacuumd_path_abi_cxx11_();
      local_38 = local_70[0];
      local_30 = (db_path->_M_dataplus)._M_p;
      local_28 = 0;
      local_84 = (*this->_vptr_gc_watch_thread[2])(this,&local_38,3);
      bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
      ::set(&this->processes_,db_path,&local_84);
      std::__cxx11::string::~string((string *)local_70);
      LOCK();
      (this->cv_).signal_.super___atomic_base<int>._M_i = -1;
      UNLOCK();
      descriptor_condition_variable::notify_all_no_except(&(this->cv_).cv_);
      goto LAB_00118edf;
    }
    this_00 = &local_48;
    message = "Maximum number of GC processes are running. Ignoring request for ";
    local_48.ptr_ = pcVar1;
  }
  pstore::gsl::not_null<const_char_*>::ensure_invariant(this_00);
  log<pstore::logger::quoted>(info,message,(quoted)this_00->ptr_);
LAB_00118edf:
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void gc_watch_thread::start_vacuum (std::string const & db_path) {
            std::unique_lock<decltype (mut_)> const lock{mut_};
            if (processes_.presentl (db_path)) {
                log (priority::info, "GC process is already running for ",
                     logger::quoted{db_path.c_str ()});
                return;
            }

            if (processes_.size () >= max_gc_processes) {
                log (priority::info,
                     "Maximum number of GC processes are running. Ignoring request for ",
                     logger::quoted{db_path.c_str ()});
                return;
            }
            log (priority::info, "Starting GC process for ", logger::quoted{db_path.c_str ()});
            processes_.set (db_path,
                            this->spawn ({vacuumd_path ().c_str (), db_path.c_str (), nullptr}));

            // An initial wakeup of the GC-watcher thread in case the child process exited
            // before we had time to install the SIGCHLD signal handler.
            cv_.notify_all (-1);
        }